

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

ON_Xform *
ON_Xform::ShearTransformation
          (ON_Xform *__return_storage_ptr__,ON_Plane *plane,ON_3dVector *x1,ON_3dVector *y1,
          ON_3dVector *z1)

{
  long lVar1;
  ON_Xform *pOVar2;
  ON_3dVector *pOVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  ON_3dVector delta;
  ON_Xform t1;
  ON_Xform s1;
  ON_Xform s0;
  ON_Xform t0;
  ON_3dVector local_348;
  ON_3dVector local_330;
  double local_318;
  double local_2f8;
  double local_2d8;
  ON_Xform local_2b0;
  ON_Xform local_230;
  ON_Xform local_1b0;
  ON_Xform local_130;
  ON_Xform local_b0;
  
  bVar5 = 0;
  ON_3dPoint::operator-(&local_348,&plane->origin,&ON_3dPoint::Origin);
  ON_3dVector::operator-(&local_330,&local_348);
  pOVar2 = &IdentityTransformation;
  pOVar4 = &local_b0;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar4->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_b0.m_xform[0][3] = local_330.x;
  local_b0.m_xform[1][3] = local_330.y;
  local_b0.m_xform[2][3] = local_330.z;
  pOVar2 = &IdentityTransformation;
  pOVar3 = &local_330;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (*(double (*) [4])&pOVar3->x)[0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar3 = (ON_3dVector *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_318 = local_348.x;
  local_2f8 = local_348.y;
  local_2d8 = local_348.z;
  pOVar2 = &IdentityTransformation;
  pOVar4 = &local_130;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar4->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  pOVar2 = &IdentityTransformation;
  pOVar4 = &local_1b0;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar4->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_130.m_xform[0][0] = (plane->xaxis).x;
  local_130.m_xform[0][1] = (plane->xaxis).y;
  local_130.m_xform[0][2] = (plane->xaxis).z;
  local_130.m_xform[1][0] = (plane->yaxis).x;
  local_130.m_xform[1][1] = (plane->yaxis).y;
  local_130.m_xform[1][2] = (plane->yaxis).z;
  local_130.m_xform[2][0] = (plane->zaxis).x;
  local_130.m_xform[2][1] = (plane->zaxis).y;
  local_130.m_xform[2][2] = (plane->zaxis).z;
  local_1b0.m_xform[0][0] = x1->x;
  local_1b0.m_xform[1][0] = x1->y;
  local_1b0.m_xform[2][0] = x1->z;
  local_1b0.m_xform[0][1] = y1->x;
  local_1b0.m_xform[1][1] = y1->y;
  local_1b0.m_xform[2][1] = y1->z;
  local_1b0.m_xform[0][2] = z1->x;
  local_1b0.m_xform[1][2] = z1->y;
  local_1b0.m_xform[2][2] = z1->z;
  operator*(&local_2b0,(ON_Xform *)&local_330,&local_1b0);
  operator*(&local_230,&local_2b0,&local_130);
  operator*(__return_storage_ptr__,&local_230,&local_b0);
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform ON_Xform::ShearTransformation(
    const ON_Plane& plane,
    const ON_3dVector& x1,
    const ON_3dVector& y1,
    const ON_3dVector& z1
  )
{
  const ON_3dVector delta = plane.origin - ON_3dPoint::Origin;
  const ON_Xform t0(ON_Xform::TranslationTransformation(-delta));
  const ON_Xform t1(ON_Xform::TranslationTransformation(delta));
  ON_Xform s0(ON_Xform::IdentityTransformation);
  ON_Xform s1(ON_Xform::IdentityTransformation);
  s0.m_xform[0][0] = plane.xaxis.x;
  s0.m_xform[0][1] = plane.xaxis.y;
  s0.m_xform[0][2] = plane.xaxis.z;
  s0.m_xform[1][0] = plane.yaxis.x;
  s0.m_xform[1][1] = plane.yaxis.y;
  s0.m_xform[1][2] = plane.yaxis.z;
  s0.m_xform[2][0] = plane.zaxis.x;
  s0.m_xform[2][1] = plane.zaxis.y;
  s0.m_xform[2][2] = plane.zaxis.z;
  s1.m_xform[0][0] = x1.x;
  s1.m_xform[1][0] = x1.y;
  s1.m_xform[2][0] = x1.z;
  s1.m_xform[0][1] = y1.x;
  s1.m_xform[1][1] = y1.y;
  s1.m_xform[2][1] = y1.z;
  s1.m_xform[0][2] = z1.x;
  s1.m_xform[1][2] = z1.y;
  s1.m_xform[2][2] = z1.z;
  return (t1*s1*s0*t0);
}